

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

effect_object_property * effect_summarize_properties(effect *ef,int *unsummarized_count)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int local_70;
  int local_6c;
  uint local_64;
  uint local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  uint local_48;
  uint local_44;
  int rmax;
  int rmin;
  timed_failure *f;
  _Bool summarized;
  dice_t *pdStack_30;
  int value_this;
  dice_t *remembered_dice;
  effect_object_property *summaries;
  int *piStack_18;
  int unsummarized;
  int *unsummarized_count_local;
  effect *ef_local;
  
  summaries._4_4_ = 0;
  remembered_dice = (dice_t *)0x0;
  pdStack_30 = (dice_t *)0x0;
  piStack_18 = unsummarized_count;
  unsummarized_count_local = (int *)ef;
  do {
    if (unsummarized_count_local == (int *)0x0) {
      if (piStack_18 != (int *)0x0) {
        *piStack_18 = summaries._4_4_;
      }
      return (effect_object_property *)remembered_dice;
    }
    uVar2 = (uint)*(ushort *)(unsummarized_count_local + 2);
    if (uVar2 != 1) {
      if (uVar2 == 8) {
        if ((-1 < unsummarized_count_local[8]) && (unsummarized_count_local[8] < 0x35)) {
          summarize_cure(unsummarized_count_local[8],(effect_object_property **)&remembered_dice,
                         (int *)((long)&summaries + 4));
        }
      }
      else if (uVar2 == 9) {
        if (pdStack_30 == (dice_t *)0x0) {
          if (*(long *)(unsummarized_count_local + 4) == 0) {
            local_54 = 0;
          }
          else {
            local_54 = dice_evaluate(*(dice_t **)(unsummarized_count_local + 4),0,MAXIMISE,
                                     (random_value *)0x0);
          }
          local_50 = local_54;
        }
        else {
          local_50 = dice_evaluate(pdStack_30,0,MAXIMISE,(random_value *)0x0);
        }
        if (((0 < local_50) || (unsummarized_count_local[8] < 0)) ||
           (0x34 < unsummarized_count_local[8])) goto LAB_00156cd1;
        summarize_cure(unsummarized_count_local[8],(effect_object_property **)&remembered_dice,
                       (int *)((long)&summaries + 4));
      }
      else if (uVar2 - 10 < 2) {
LAB_00156cd1:
        if (pdStack_30 == (dice_t *)0x0) {
          if (*(long *)(unsummarized_count_local + 4) == 0) {
            local_5c = 0;
          }
          else {
            local_5c = dice_evaluate(*(dice_t **)(unsummarized_count_local + 4),0,MAXIMISE,
                                     (random_value *)0x0);
          }
          local_58 = local_5c;
        }
        else {
          local_58 = dice_evaluate(pdStack_30,0,MAXIMISE,(random_value *)0x0);
        }
        if (((0 < local_58) && (-1 < unsummarized_count_local[8])) &&
           (unsummarized_count_local[8] < 0x35)) {
          bVar3 = timed_effects[unsummarized_count_local[8]].oflag_dup != 0;
          if (bVar3) {
            add_to_summaries((effect_object_property **)&remembered_dice,
                             timed_effects[unsummarized_count_local[8]].oflag_dup,0,0,
                             (uint)((timed_effects[unsummarized_count_local[8]].oflag_syn & 1U) == 0
                                   ));
          }
          if (-1 < timed_effects[unsummarized_count_local[8]].temp_resist) {
            local_44 = 10;
            local_48 = 200;
            for (_rmax = timed_effects[unsummarized_count_local[8]].fail;
                _rmax != (timed_failure *)0x0; _rmax = _rmax->next) {
              if (_rmax->idx == timed_effects[unsummarized_count_local[8]].temp_resist) {
                if (_rmax->code == 2) {
                  if (local_44 < 0x51) {
                    local_60 = 0x51;
                  }
                  else {
                    local_60 = local_44;
                  }
                  local_44 = local_60;
                }
                else if (_rmax->code == 3) {
                  if (local_48 < 0x65) {
                    local_64 = local_48;
                  }
                  else {
                    local_64 = 100;
                  }
                  local_48 = local_64;
                }
              }
            }
            add_to_summaries((effect_object_property **)&remembered_dice,
                             timed_effects[unsummarized_count_local[8]].temp_resist,local_44,
                             local_48,EFPROP_RESIST);
            bVar3 = true;
          }
          for (_rmax = timed_effects[unsummarized_count_local[8]].fail;
              _rmax != (timed_failure *)0x0; _rmax = _rmax->next) {
            iVar1 = _rmax->code;
            if (iVar1 == 1) {
              add_to_summaries((effect_object_property **)&remembered_dice,_rmax->idx,0,0,
                               EFPROP_CONFLICT_FLAG);
              bVar3 = true;
            }
            else if (iVar1 == 2) {
              if (_rmax->idx != timed_effects[unsummarized_count_local[8]].temp_resist) {
                add_to_summaries((effect_object_property **)&remembered_dice,_rmax->idx,0x51,200,
                                 EFPROP_CONFLICT_RESIST);
                bVar3 = true;
              }
            }
            else if ((iVar1 == 3) &&
                    (_rmax->idx != timed_effects[unsummarized_count_local[8]].temp_resist)) {
              add_to_summaries((effect_object_property **)&remembered_dice,_rmax->idx,0,100,
                               EFPROP_CONFLICT_VULN);
              bVar3 = true;
            }
          }
          if (-1 < timed_effects[unsummarized_count_local[8]].temp_brand) {
            add_to_summaries((effect_object_property **)&remembered_dice,
                             timed_effects[unsummarized_count_local[8]].temp_brand,0,0,EFPROP_BRAND)
            ;
            bVar3 = true;
          }
          if (-1 < timed_effects[unsummarized_count_local[8]].temp_slay) {
            add_to_summaries((effect_object_property **)&remembered_dice,
                             timed_effects[unsummarized_count_local[8]].temp_slay,0,0,EFPROP_SLAY);
            bVar3 = true;
          }
          if (!bVar3) {
            summaries._4_4_ = summaries._4_4_ + 1;
          }
        }
      }
      else if (uVar2 == 0xd) {
        if (pdStack_30 == (dice_t *)0x0) {
          if (*(long *)(unsummarized_count_local + 4) == 0) {
            local_70 = 0;
          }
          else {
            local_70 = dice_evaluate(*(dice_t **)(unsummarized_count_local + 4),0,MAXIMISE,
                                     (random_value *)0x0);
          }
          local_6c = local_70;
        }
        else {
          local_6c = dice_evaluate(pdStack_30,0,MAXIMISE,(random_value *)0x0);
        }
        if (0 < local_6c) {
          summarize_cure(unsummarized_count_local[8],(effect_object_property **)&remembered_dice,
                         (int *)((long)&summaries + 4));
        }
      }
      else if (uVar2 - 0x3b < 3) {
        add_to_summaries((effect_object_property **)&remembered_dice,0x1d,0,0,EFPROP_CONFLICT_FLAG);
      }
      else if (uVar2 != 0x7a) {
        if (uVar2 == 0x7b) {
          pdStack_30 = *(dice_t **)(unsummarized_count_local + 4);
        }
        else if (uVar2 == 0x7c) {
          pdStack_30 = (dice_t *)0x0;
        }
        else {
          summaries._4_4_ = summaries._4_4_ + 1;
        }
      }
    }
    unsummarized_count_local = *(int **)unsummarized_count_local;
  } while( true );
}

Assistant:

struct effect_object_property *effect_summarize_properties(
		const struct effect *ef, int *unsummarized_count)
{
	int unsummarized = 0;
	struct effect_object_property *summaries = NULL;
	dice_t *remembered_dice = NULL;

	for (; ef; ef = ef->next) {
		int value_this;

		switch (ef->index) {
		case EF_RANDOM:
		case EF_SELECT:
			/*
			 * For random or select effects, summarize all of the
			 * subeffects since any of them is possible.  That's
			 * equivalent to simply skipping over the random or
			 * select effect and stepping one by one through what
			 * follows.
			 */
			break;

		case EF_SET_VALUE:
			/*
			 * Remember the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = ef->dice;
			break;

		case EF_CLEAR_VALUE:
			/*
			 * Forget the value.  Does nothing that should be
			 * remembered in the summaries or unsummarized count.
			 */
			remembered_dice = NULL;
			break;

		case EF_CURE:
			if (ef->subtype >= 0 && ef->subtype < TMD_MAX) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TIMED_SET:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this <= 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				/* It's equivalent to a cure. */
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
				break;
			}
			/* Fall through. */

		case EF_TIMED_INC:
		case EF_TIMED_INC_NO_RES:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			if (value_this > 0 && ef->subtype >= 0 &&
					ef->subtype < TMD_MAX) {
				bool summarized = false;
				const struct timed_failure *f;

				if (timed_effects[ef->subtype].oflag_dup !=
						OF_NONE) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].oflag_dup,
						0, 0,
						timed_effects[ef->subtype].oflag_syn ?
						EFPROP_OBJECT_FLAG_EXACT : EFPROP_OBJECT_FLAG);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_resist >= 0) {
					/*
					 * At RES_LEVEL_BASE, the benefit from
					 * RES_BOOST_NORMAL is a drop of 40
					 * in the resistance level.  When the
					 * benefit drops to less than a 1/10th
					 * of that say that there's limited
					 * benefit.  That happens when the
					 * resistance level is less than 10.
					 */
					int rmin = 10, rmax = RES_LEVEL_MIN;

					f = timed_effects[ef->subtype].fail;
					while (f) {
						if (f->idx == timed_effects[ef->subtype].temp_resist) {
							if (f->code == TMD_FAIL_FLAG_RESIST) {
								rmin = MAX(rmin, RES_LEVEL_EFFECT + 1);
							} else if (f->code == TMD_FAIL_FLAG_VULN) {
								rmax = MIN(rmax, RES_LEVEL_BASE);
							}
						}
						f = f->next;
					}
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_resist,
						rmin, rmax, EFPROP_RESIST);
					summarized = true;
				}
				f = timed_effects[ef->subtype].fail;
				while (f) {
					switch (f->code) {
					case TMD_FAIL_FLAG_OBJECT:
						add_to_summaries(&summaries,
							f->idx, 0, 0,
							EFPROP_CONFLICT_FLAG);
						summarized = true;
						break;

					case TMD_FAIL_FLAG_RESIST:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_EFFECT + 1,
								RES_LEVEL_MIN,
								EFPROP_CONFLICT_RESIST);
							summarized = true;
						}
						break;

					case TMD_FAIL_FLAG_VULN:
						if (f->idx != timed_effects[ef->subtype].temp_resist) {
							add_to_summaries(
								&summaries,
								f->idx,
								RES_LEVEL_MAX,
								RES_LEVEL_BASE,
								EFPROP_CONFLICT_VULN);
							summarized = true;
						}
						break;

					default:
						/* Nothing special is needed. */
						break;
					}
					f = f->next;
				}
				if (timed_effects[ef->subtype].temp_brand >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_brand,
						0, 0, EFPROP_BRAND);
					summarized = true;
				}
				if (timed_effects[ef->subtype].temp_slay >= 0) {
					add_to_summaries(&summaries,
						timed_effects[ef->subtype].temp_slay,
						0, 0, EFPROP_SLAY);
					summarized = true;
				}
				if (!summarized) ++unsummarized;
			}
			break;

		case EF_TIMED_DEC:
			value_this = (remembered_dice) ?
				dice_evaluate(remembered_dice, 0, MAXIMISE, NULL) :
				((ef->dice) ?
				dice_evaluate(ef->dice, 0, MAXIMISE, NULL) : 0);
			/* If it decreases the duration, it's a partial cure. */
			if (value_this > 0) {
				summarize_cure(ef->subtype, &summaries,
					&unsummarized);
			}
			break;

		case EF_TELEPORT:
		case EF_TELEPORT_TO:
		case EF_TELEPORT_LEVEL:
			add_to_summaries(&summaries, OF_NO_TELEPORT,
				0, 0, EFPROP_CONFLICT_FLAG);
			break;

		/*
		 * There's other effects that have limited utility when the
		 * object already has some flags:
		 * DISABLE_TRAPS with OF_TRAP_IMMUNE is only good for unlocking
		 * DETECT_INVISIBLE with OF_SEE_INVISIBLE or OF_TELEPATHY
		 * RESTORE_x with OF_SUST_x
		 * RESTORE_EXP with OF_HOLD_LIFE
		 * For now, don't try to flag those.
		 */
		default:
			/*
			 * Everything else isn't related to an object property.
			 */
			++unsummarized;
			break;
		}
	}

	if (unsummarized_count) *unsummarized_count = unsummarized;
	return summaries;
}